

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **param_2)

{
  clock_t cVar1;
  ostream *poVar2;
  clock_t cVar3;
  long lVar4;
  undefined1 auVar5 [16];
  exception *exc;
  uint64_t t;
  char **param_1_local;
  int argc_local;
  
  cVar1 = clock();
  testingBN();
  testing();
  testingMul();
  testingExp();
  if (1 < argc) {
    resulttest();
  }
  std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),3);
  poVar2 = std::operator<<((ostream *)&std::cout,"Seconds: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::fixed);
  cVar3 = clock();
  lVar4 = cVar3 - cVar1;
  auVar5._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar5._0_8_ = lVar4;
  auVar5._12_4_ = 0x45300000;
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,((auVar5._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) /
                             1000000.0);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int argc, char**) {
    uint64_t t = clock();

    try {
        testingBN();
        testing();
        testingMul();
        testingExp();
        if (argc > 1)
            resulttest();
    } catch (const std::exception& exc) {
        cerr << exc.what() << endl;
        return -1;
    }
    cout.precision(3);
    cout << "Seconds: " << fixed << static_cast<double>(clock() - t) / CLOCKS_PER_SEC << endl;
    return 0;
}